

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

BUFFER_HANDLE BUFFER_create_with_size(size_t buff_size)

{
  void *pvVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  BUFFER *result;
  size_t buff_size_local;
  
  l = (LOGGER_LOG)calloc(1,0x10);
  if (l == (LOGGER_LOG)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/buffer.c"
                ,"BUFFER_create_with_size",0x7b,1,"unable to allocate BUFFER");
    }
  }
  else if (buff_size == 0) {
    *(undefined8 *)(l + 8) = 0;
    *(undefined8 *)l = 0;
  }
  else {
    *(size_t *)(l + 8) = buff_size;
    pvVar1 = malloc(*(size_t *)(l + 8));
    *(void **)l = pvVar1;
    if (pvVar1 == (void *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/buffer.c"
                  ,"BUFFER_create_with_size",0x72,1,"unable to allocate buffer");
      }
      free(l);
      l = (LOGGER_LOG)0x0;
    }
  }
  return (BUFFER_HANDLE)l;
}

Assistant:

BUFFER_HANDLE BUFFER_create_with_size(size_t buff_size)
{
    BUFFER* result;
    result = (BUFFER*)calloc(1, sizeof(BUFFER));
    if (result != NULL)
    {
        if (buff_size == 0)
        {
            // Codes_SRS_BUFFER_07_030: [ If buff_size is 0 BUFFER_create_with_size shall create a valid non-NULL handle of zero size. ]
            result->size = 0;
            result->buffer = NULL;
        }
        else
        {
            // Codes_SRS_BUFFER_07_031: [ BUFFER_create_with_size shall allocate a buffer of buff_size. ]
            result->size = buff_size;
            if ((result->buffer = (unsigned char*)malloc(result->size)) == NULL)
            {
                // Codes_SRS_BUFFER_07_032: [ If allocating memory fails, then BUFFER_create_with_size shall return NULL. ]
                LogError("unable to allocate buffer");
                free(result);
                result = NULL;
            }
        }
    }
    else
    {
        // Codes_SRS_BUFFER_07_032: [ If allocating memory fails, then BUFFER_create_with_size shall return NULL. ]
        LogError("unable to allocate BUFFER");
    }
    // Codes_SRS_BUFFER_07_033: [ Otherwise, BUFFER_create_with_size shall return a non-NULL handle. ]
    return (BUFFER_HANDLE)result;
}